

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

uint32_t kratos::num_size_decrease(Var *var)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  pointer puVar4;
  pointer puVar5;
  long lVar6;
  int iVar7;
  
  uVar3 = 0;
  if (var->type_ == Slice) {
    puVar4 = (var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar2 = 0;
    do {
      iVar7 = iVar2;
      lVar6 = (long)puVar5 - (long)puVar4;
      var = (Var *)var[1].super_IRNode._vptr_IRNode;
      puVar4 = (var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = (var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      iVar1 = (int)((long)puVar5 - (long)puVar4 >> 2) - (int)(lVar6 >> 2);
      iVar2 = iVar7 + iVar1;
    } while (var->type_ == Slice);
    uVar3 = iVar7 + iVar1;
  }
  return uVar3;
}

Assistant:

uint32_t num_size_decrease(Var *var) {
    if (var->type() == VarType::Slice) {
        auto *slice = reinterpret_cast<VarSlice *>(var);
        auto *parent = slice->parent_var;
        auto diff = parent->size().size() - slice->size().size();
        if (parent->type() == VarType::Slice) {
            return diff + num_size_decrease(reinterpret_cast<VarSlice *>(parent));
        } else {
            // base case 1
            return diff;
        }
    }
    // base case 0
    return 0;
}